

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFileSystem.cpp
# Opt level: O0

bool __thiscall irr::io::CFileSystem::changeWorkingDirectoryTo(CFileSystem *this,path *newDirectory)

{
  int iVar1;
  char *__path;
  string<char> *in_RDI;
  bool success;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *c;
  string<char> *in_stack_ffffffffffffffc8;
  bool local_11;
  
  if ((int)(in_RDI->str)._M_string_length == 0) {
    core::string<char>::operator=(in_stack_ffffffffffffffc8,in_RDI);
    __path = core::string<char>::c_str((string<char> *)0x381831);
    iVar1 = chdir(__path);
    local_11 = iVar1 == 0;
  }
  else {
    core::string<char>::operator=(in_stack_ffffffffffffffc8,in_RDI);
    c = &in_RDI[1].str.field_2;
    core::string<char>::string<char>(in_RDI,c->_M_local_buf);
    (**(code **)(*(long *)&in_RDI->str + 0xb0))(in_RDI,c,&stack0xffffffffffffffc8);
    core::string<char>::~string((string<char> *)0x38180d);
    local_11 = true;
  }
  return local_11;
}

Assistant:

bool CFileSystem::changeWorkingDirectoryTo(const io::path &newDirectory)
{
	bool success = false;

	if (FileSystemType != FILESYSTEM_NATIVE) {
		WorkingDirectory[FILESYSTEM_VIRTUAL] = newDirectory;
		// is this empty string constant really intended?
		flattenFilename(WorkingDirectory[FILESYSTEM_VIRTUAL], _IRR_TEXT(""));
		success = true;
	} else {
		WorkingDirectory[FILESYSTEM_NATIVE] = newDirectory;

#if defined(_MSC_VER)
		success = (_chdir(newDirectory.c_str()) == 0);
#else
		success = (chdir(newDirectory.c_str()) == 0);
#endif
	}

	return success;
}